

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SchemaClear(void *p)

{
  Table *in_RDI;
  Table *pTab;
  Schema *pSchema;
  HashElem *pElem;
  Hash temp2;
  Hash temp1;
  Trigger *in_stack_ffffffffffffffa8;
  sqlite3 *in_stack_ffffffffffffffb0;
  undefined8 *puVar1;
  sqlite3 *db;
  
  db = (sqlite3 *)in_RDI->pIndex;
  puVar1 = *(undefined8 **)&in_RDI->iPKey;
  sqlite3HashInit((Hash *)&in_RDI->nRowLogEst);
  sqlite3HashClear((Hash *)in_stack_ffffffffffffffb0);
  for (; puVar1 != (undefined8 *)0x0; puVar1 = (undefined8 *)*puVar1) {
    sqlite3DeleteTrigger(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  sqlite3HashClear((Hash *)in_stack_ffffffffffffffb0);
  sqlite3HashInit((Hash *)&in_RDI->aCol);
  for (; db != (sqlite3 *)0x0; db = (sqlite3 *)db->pVfs) {
    in_stack_ffffffffffffffb0 = (sqlite3 *)db->pDfltColl;
    sqlite3DeleteTable(db,in_RDI);
  }
  sqlite3HashClear((Hash *)in_stack_ffffffffffffffb0);
  sqlite3HashClear((Hash *)in_stack_ffffffffffffffb0);
  in_RDI->pTrigger = (Trigger *)0x0;
  if (((ulong)in_RDI->pSchema & 0x10000) != 0) {
    *(int *)((long)&in_RDI->zName + 4) = *(int *)((long)&in_RDI->zName + 4) + 1;
    *(ushort *)((long)&in_RDI->pSchema + 2) = *(ushort *)((long)&in_RDI->pSchema + 2) & 0xfffe;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;

  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(0, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(0, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
    pSchema->schemaFlags &= ~DB_SchemaLoaded;
  }
}